

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storedenum.hpp
# Opt level: O3

flag_type __thiscall
stored_flags<setup::(anonymous_namespace)::stored_architectures_1,_32UL>::get
          (stored_flags<setup::(anonymous_namespace)::stored_architectures_1,_32UL> *this)

{
  byte *pbVar1;
  logger *plVar2;
  size_t i;
  ulong uVar3;
  _Base_bitset<1UL> _Var4;
  ulong uVar5;
  ostringstream *poVar6;
  logger local_198;
  
  uVar5 = (ulong)this & 0xff;
  pbVar1 = &setup::(anonymous_namespace)::stored_architectures_1::values;
  uVar3 = 0;
  _Var4._M_w = 0;
  do {
    if ((uVar5 >> (uVar3 & 0x3f) & 1) != 0) {
      _Var4._M_w = _Var4._M_w | 1L << ((ulong)*pbVar1 & 0x3f);
      uVar5 = uVar5 & ~(1L << ((byte)uVar3 & 0x3f));
    }
    uVar3 = uVar3 + 1;
    pbVar1 = pbVar1 + 4;
  } while (uVar3 != 5);
  if (uVar5 != 0) {
    local_198.level = Warning;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198.buffer);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.buffer,"Unexpected ",0xb);
    plVar2 = logger::operator<<(&local_198,
                                &enum_names<setup::header::architecture_types_Enum_>::name);
    poVar6 = &plVar2->buffer;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6," flags: ",8);
    *(uint *)(&plVar2->field_0x20 + *(long *)(*(long *)poVar6 + -0x18)) =
         *(uint *)(&plVar2->field_0x20 + *(long *)(*(long *)poVar6 + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    *(uint *)(&plVar2->field_0x20 + *(long *)(*(long *)poVar6 + -0x18)) =
         *(uint *)(&plVar2->field_0x20 + *(long *)(*(long *)poVar6 + -0x18)) & 0xffffffb5 | 2;
    logger::~logger(&local_198);
  }
  return (flag_type)_Var4._M_w;
}

Assistant:

boost::uint64_t lower_bits() const {
		
		BOOST_STATIC_ASSERT(sizeof(boost::uint64_t) % sizeof(base_type) == 0);
		
		boost::uint64_t result = 0;
		
		for(size_t i = 0; i < std::min(sizeof(boost::uint64_t) / sizeof(base_type), size_t(count)); i++) {
			result |= (boost::uint64_t(bits[i]) << (i * base_size));
		}
		
		return result;
	}